

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIOReadKeyValue(FmsIOContext *ctx,char *key,char *value)

{
  char *pcVar1;
  size_t __n;
  int iVar2;
  ulong __n_00;
  char buff [1024];
  
  pcVar1 = fgets(buff,0x400,(FILE *)ctx->fp);
  if (pcVar1 == (char *)0x0) {
    iVar2 = 2;
  }
  else {
    pcVar1 = strchr(buff,0x3a);
    if (pcVar1 == (char *)0x0) {
      iVar2 = 3;
    }
    else {
      if (key != (char *)0x0) {
        __n_00 = (long)pcVar1 - (long)buff;
        if (0x1ff < __n_00) {
          return 4;
        }
        memcpy(key,buff,__n_00);
        key[__n_00] = '\0';
      }
      iVar2 = 0;
      if (value != (char *)0x0) {
        __n = strlen(pcVar1 + 2);
        if (__n < 0x200) {
          memcpy(value,pcVar1 + 2,__n);
          value[__n - 1] = '\0';
          iVar2 = 0;
        }
        else {
          iVar2 = 5;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
FmsIOReadKeyValue(FmsIOContext *ctx, char *key, char *value) {
  char buff[FMS_BUFFER_SIZE * 2];
  FmsInt N = 0;
  char *key_end = NULL;
  if(!ctx) E_RETURN(1);
  if(fgets(buff, FMS_BUFFER_SIZE * 2, ctx->fp) == NULL)
    return 2;   // This could mean EoF which is not always an error.
  if((key_end = strchr(buff, ':')) == NULL)
    E_RETURN(3);

  if(key) {
    N = key_end - buff;
    if(N >= FMS_BUFFER_SIZE)
      E_RETURN(4);
    memcpy(key, buff, N);
    key[N] = '\0';
  }

  // After the ':' is a space then the value starts
  if(value) {
    N = strlen(key_end+2);
    if(N >= FMS_BUFFER_SIZE)
      E_RETURN(5);
    // Remove the \n from the end
    memcpy(value, key_end+2, N);
    value[N-1] = '\0';
    // value[N] = '\0';
  }
  return 0;
}